

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_cmp_mag(mp_int *a,mp_int *b)

{
  mp_digit *tmpb;
  mp_digit *tmpa;
  int n;
  mp_int *b_local;
  mp_int *a_local;
  int local_4;
  
  if (b->used < a->used) {
    local_4 = 1;
  }
  else if (a->used < b->used) {
    local_4 = -1;
  }
  else {
    tmpa = a->dp + (a->used + -1);
    tmpb = b->dp + (a->used + -1);
    for (n = 0; n < a->used; n = n + 1) {
      if (*tmpb < *tmpa) {
        return 1;
      }
      if (*tmpa < *tmpb) {
        return -1;
      }
      tmpa = tmpa + -1;
      tmpb = tmpb + -1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_cmp_mag (mp_int * a, mp_int * b)
{
  int     n;
  mp_digit *tmpa, *tmpb;

  /* compare based on # of non-zero digits */
  if (a->used > b->used) {
    return MP_GT;
  }
  
  if (a->used < b->used) {
    return MP_LT;
  }

  /* alias for a */
  tmpa = a->dp + (a->used - 1);

  /* alias for b */
  tmpb = b->dp + (a->used - 1);

  /* compare based on digits  */
  for (n = 0; n < a->used; ++n, --tmpa, --tmpb) {
    if (*tmpa > *tmpb) {
      return MP_GT;
    }

    if (*tmpa < *tmpb) {
      return MP_LT;
    }
  }
  return MP_EQ;
}